

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O3

JavascriptString * __thiscall
Js::DynamicObjectPropertyEnumerator::MoveAndGetNextNoCache
          (DynamicObjectPropertyEnumerator *this,PropertyId *propertyId,
          PropertyAttributes *attributes)

{
  DynamicObject *pDVar1;
  uint uVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  DynamicTypeHandler *pDVar6;
  PolymorphicInlineCache *polymorphicInlineCache;
  DynamicType *typeToEnumerate;
  undefined1 local_88 [8];
  PropertyValueInfo info;
  FunctionBody *local_40;
  JavascriptString *propertyString;
  BigPropertyIndex newIndex;
  
  local_40 = (FunctionBody *)0x0;
  propertyString._4_4_ = this->objectIndex;
  local_88 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  info._56_8_ = (this->object).ptr;
  do {
    propertyString._4_4_ = propertyString._4_4_ + 1;
    PropertyValueInfo::ClearCacheInfo((PropertyValueInfo *)local_88);
    pDVar1 = (this->object).ptr;
    if ((((this->flags & SnapShotSemantics) == None) ||
        (typeToEnumerate = (this->initialType).ptr, typeToEnumerate->isLocked != true)) ||
       (DAT_015bf344 == '\0')) {
      typeToEnumerate = (DynamicType *)(pDVar1->super_RecyclableObject).type.ptr;
    }
    BVar4 = DynamicObject::FindNextProperty
                      (pDVar1,(BigPropertyIndex *)((long)&propertyString + 4),
                       (JavascriptString **)&local_40,propertyId,attributes,typeToEnumerate,
                       this->flags,(this->scriptContext).ptr,(PropertyValueInfo *)local_88);
    uVar2 = propertyString._4_4_;
    if (BVar4 == 0) {
LAB_00db0e51:
      propertyString._4_4_ = propertyString._4_4_ - 1;
      local_40 = (FunctionBody *)0x0;
      PropertyValueInfo::ClearCacheInfo((PropertyValueInfo *)local_88);
      break;
    }
    if ((this->flags & SnapShotSemantics) != None) {
      pDVar6 = DynamicObject::GetTypeHandler((this->object).ptr);
      iVar5 = (*pDVar6->_vptr_DynamicTypeHandler[0x62])(pDVar6,(ulong)uVar2);
      if (this->initialPropertyCount <= iVar5) goto LAB_00db0e51;
    }
  } while ((uint)*propertyId < 0x10);
  if (((((info.prop != (RecyclableObject *)0x0) &&
        (bVar3 = PropertyRecordUsageCache::ShouldUseCache((PropertyRecordUsageCache *)info.prop),
        bVar3)) &&
       ((local_40 == info.functionBody &&
        ((CacheOperators::CachePropertyRead
                    ((Var)info._56_8_,&((this->object).ptr)->super_RecyclableObject,false,
                     *propertyId,false,(PropertyValueInfo *)local_88,(this->scriptContext).ptr),
         (this->flags & EphemeralReference) == None && (((ulong)info.m_instance & 0x400000000) != 0)
         ))))) && (((ulong)info.m_instance & 0x40000) != 0)) &&
     (((ulong)info.m_instance & 0x3000000) == 0)) {
    polymorphicInlineCache =
         PropertyRecordUsageCache::GetStElemInlineCache((PropertyRecordUsageCache *)info.prop);
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_88,polymorphicInlineCache,
               (bool)info.propertyRecordUsageCache._5_1_);
    pDVar1 = (this->object).ptr;
    CacheOperators::CachePropertyWrite
              (&pDVar1->super_RecyclableObject,false,(pDVar1->super_RecyclableObject).type.ptr,
               *propertyId,(PropertyValueInfo *)local_88,(this->scriptContext).ptr);
  }
  this->objectIndex = propertyString._4_4_;
  return (JavascriptString *)local_40;
}

Assistant:

JavascriptString * DynamicObjectPropertyEnumerator::MoveAndGetNextNoCache(PropertyId& propertyId, PropertyAttributes * attributes)
    {
        JavascriptString* propertyString = nullptr;
        BigPropertyIndex newIndex = this->objectIndex;
        PropertyValueInfo info;
        RecyclableObject * startingObject = this->object;
        do
        {
            newIndex++;
            PropertyValueInfo::ClearCacheInfo(&info);
            if (!this->object->FindNextProperty(newIndex, &propertyString, &propertyId, attributes,
                GetTypeToEnumerate(), flags, this->scriptContext, &info)
                || (GetSnapShotSemantics() && PropertyIndexToPropertyEnumeration(newIndex) >= initialPropertyCount))
            {
                // No more properties
                newIndex--;
                propertyString = nullptr;
                PropertyValueInfo::ClearCacheInfo(&info);
                break;
            }
        } while (Js::IsInternalPropertyId(propertyId));

        if (info.GetPropertyRecordUsageCache() != nullptr && info.GetPropertyRecordUsageCache()->ShouldUseCache() && propertyString == info.GetProperty())
        {
            CacheOperators::CachePropertyRead(startingObject, this->object, false, propertyId, false, &info, scriptContext);
            if ((!(this->flags & EnumeratorFlags::EphemeralReference)) && info.IsStoreFieldCacheEnabled() && info.IsWritable() && ((info.GetFlags() & (InlineCacheGetterFlag | InlineCacheSetterFlag)) == 0))
            {
                PropertyValueInfo::SetCacheInfo(&info, info.GetPropertyRecordUsageCache()->GetStElemInlineCache(), info.AllowResizingPolymorphicInlineCache());
                CacheOperators::CachePropertyWrite(this->object, false, this->object->GetType(), propertyId, &info, scriptContext);
            }
        }
        this->objectIndex = newIndex;
        return propertyString;
    }